

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b8a13::CAPIBuildSystemFrontendDelegate::commandProcessStarted
          (CAPIBuildSystemFrontendDelegate *this,Command *command,ProcessHandle handle)

{
  Command *command_local;
  CAPIBuildSystemFrontendDelegate *this_local;
  ProcessHandle handle_local;
  
  if ((this->cAPIDelegate).command_process_started !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr *)0x0) {
    (*(this->cAPIDelegate).command_process_started)
              ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,
               (llb_buildsystem_process_t *)handle.id);
  }
  return;
}

Assistant:

virtual void commandProcessStarted(Command* command,
                                     ProcessHandle handle) override {
    if (cAPIDelegate.command_process_started) {
      cAPIDelegate.command_process_started(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          (llb_buildsystem_process_t*) handle.id);
    }
  }